

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_binsri_df_mips64
               (CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t u5)

{
  int iVar1;
  int64_t iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  fpr_t *pfVar6;
  fpr_t *pfVar7;
  
  if (df < 4) {
    pfVar6 = (env->active_fpu).fpr + wd;
    pfVar7 = (env->active_fpu).fpr + ws;
    switch(df) {
    case 0:
      for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
        iVar2 = msa_binsr_df(0,(long)*(char *)((long)pfVar6 + lVar5),
                             (long)*(char *)((long)pfVar7 + lVar5),(ulong)u5);
        *(char *)((long)pfVar6 + lVar5) = (char)iVar2;
      }
      break;
    case 1:
      for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
        iVar2 = msa_binsr_df(1,(long)*(short *)((long)pfVar6 + lVar5 * 2),
                             (long)*(short *)((long)pfVar7 + lVar5 * 2),(ulong)u5);
        *(short *)((long)pfVar6 + lVar5 * 2) = (short)iVar2;
      }
      break;
    case 2:
      for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
        iVar2 = msa_binsr_df(2,(long)(int)pfVar6->fs[lVar5],(long)(int)pfVar7->fs[lVar5],(ulong)u5);
        pfVar6->fs[lVar5] = (float32)iVar2;
      }
      break;
    case 3:
      iVar1 = (u5 & 0x3f) + 1;
      if (iVar1 == 0x40) {
        pfVar6->fd = pfVar7->fd;
        uVar3 = *(ulong *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
      }
      else {
        uVar3 = 0xffffffffffffffff >> (~(byte)(u5 & 0x3f) & 0x3f);
        uVar4 = -1L << ((byte)iVar1 & 0x3f);
        pfVar6->fd = pfVar7->fd & uVar3 | pfVar6->fd & uVar4;
        uVar3 = uVar3 & *(ulong *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8) |
                uVar4 & *(ulong *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8);
      }
      *(ulong *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = uVar3;
    }
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                ,0x11f2,
                "void helper_msa_binsri_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
               );
}

Assistant:

static inline int64_t msa_subs_s_df(uint32_t df, int64_t arg1, int64_t arg2)
{
    int64_t max_int = DF_MAX_INT(df);
    int64_t min_int = DF_MIN_INT(df);
    if (arg2 > 0) {
        return (min_int + arg2 < arg1) ? arg1 - arg2 : min_int;
    } else {
        return (arg1 < max_int + arg2) ? arg1 - arg2 : max_int;
    }
}